

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O1

void cppurses::detail::Screen::paint_resize_event(Widget *widg,Screen_descriptor *staged_tiles)

{
  long lVar1;
  ulong uVar2;
  const_iterator cVar3;
  undefined8 uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  Point point;
  Glyph local_78;
  Point local_60;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  paint_empty_tiles(widg);
  cover_leftovers(widg,staged_tiles);
  uVar7 = (widg->screen_state_).optimize.resize_mask.offset_.y;
  local_38 = (widg->screen_state_).optimize.resize_mask.area_.height + uVar7;
  if (uVar7 < local_38) {
    local_40 = (widg->screen_state_).optimize.resize_mask.offset_.x;
    local_48 = (widg->screen_state_).optimize.resize_mask.area_.width;
    local_50 = local_40 + local_48;
    do {
      sVar6 = local_48;
      uVar8 = local_40;
      if (local_40 < local_50) {
        do {
          lVar1 = (uVar7 - (widg->screen_state_).optimize.resize_mask.offset_.y) *
                  (widg->screen_state_).optimize.resize_mask.area_.width -
                  (widg->screen_state_).optimize.resize_mask.offset_.x;
          uVar5 = uVar8 + lVar1;
          uVar2 = uVar8 + 0x3f + lVar1;
          if (-1 < (long)uVar5) {
            uVar2 = uVar5;
          }
          local_60.x = uVar8;
          local_60.y = uVar7;
          if (((widg->screen_state_).optimize.resize_mask.bits_.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p
               [((long)uVar2 >> 6) +
                (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar5 & 0x3f) & 1) == 0) {
            cVar3 = std::
                    _Hashtable<cppurses::Point,_std::pair<const_cppurses::Point,_cppurses::Glyph>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>,_std::__detail::_Select1st,_std::equal_to<cppurses::Point>,_std::hash<cppurses::Point>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&staged_tiles->_M_h,&local_60);
            if (cVar3.
                super__Node_iterator_base<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false>.
                _M_cur != (__node_type *)0x0) {
              cVar3 = std::
                      _Hashtable<cppurses::Point,_std::pair<const_cppurses::Point,_cppurses::Glyph>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>,_std::__detail::_Select1st,_std::equal_to<cppurses::Point>,_std::hash<cppurses::Point>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&staged_tiles->_M_h,&local_60);
              if (cVar3.
                  super__Node_iterator_base<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false>
                  ._M_cur == (__node_type *)0x0) {
                uVar4 = std::__throw_out_of_range("_Map_base::at");
                if (local_78.brush.foreground_color_.initialized_ == true) {
                  local_78.brush.foreground_color_.initialized_ = false;
                }
                if (local_78.brush.background_color_.initialized_ == true) {
                  local_78.brush.background_color_.initialized_ = false;
                }
                _Unwind_Resume(uVar4);
              }
              local_78.symbol =
                   *(wchar_t *)
                    ((long)cVar3.
                           super__Node_iterator_base<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false>
                           ._M_cur + 0x18);
              local_78.brush.attributes_.super__Base_bitset<1UL>._M_w =
                   *(_Base_bitset<1UL> *)
                    ((long)cVar3.
                           super__Node_iterator_base<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false>
                           ._M_cur + 0x20);
              local_78.brush.background_color_.initialized_ =
                   *(char *)((long)cVar3.
                                   super__Node_iterator_base<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false>
                                   ._M_cur + 0x28) == '\x01';
              if (local_78.brush.background_color_.initialized_) {
                local_78.brush.background_color_.storage_.data_ =
                     *(uchar (*) [2])
                      ((long)cVar3.
                             super__Node_iterator_base<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false>
                             ._M_cur + 0x2a);
              }
              local_78.brush.foreground_color_.initialized_ =
                   *(char *)((long)cVar3.
                                   super__Node_iterator_base<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false>
                                   ._M_cur + 0x2c) == '\x01';
              if (local_78.brush.foreground_color_.initialized_) {
                local_78.brush.foreground_color_.storage_.data_ =
                     *(uchar (*) [2])
                      ((long)cVar3.
                             super__Node_iterator_base<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false>
                             ._M_cur + 0x2e);
              }
              basic_paint_single_point(widg,&local_60,&local_78);
              if (local_78.brush.foreground_color_.initialized_ == true) {
                local_78.brush.foreground_color_.initialized_ = false;
              }
              if (local_78.brush.background_color_.initialized_ == true) {
                local_78.brush.background_color_.initialized_ = false;
              }
            }
          }
          else {
            full_paint_single_point(widg,staged_tiles,&local_60);
          }
          uVar8 = uVar8 + 1;
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_38);
  }
  return;
}

Assistant:

void Screen::paint_resize_event(Widget& widg,
                                const Screen_descriptor& staged_tiles)
{
    paint_empty_tiles(widg);
    cover_leftovers(widg, staged_tiles);
    const auto& new_space = widg.screen_state().optimize.resize_mask;
    const auto y_begin    = new_space.offset().y;
    const auto x_begin    = new_space.offset().x;
    const auto y_end      = y_begin + new_space.area().height;
    const auto x_end      = x_begin + new_space.area().width;
    for (auto y = y_begin; y < y_end; ++y) {
        for (auto x = x_begin; x < x_end; ++x) {
            const Point point{x, y};
            if (new_space.at(x, y)) {
                full_paint_single_point(widg, staged_tiles, point);
            }
            else if (contains(point, staged_tiles)) {
                basic_paint_single_point(widg, point, staged_tiles.at(point));
            }
        }
    }
}